

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QtDependency>::copyAppend
          (QGenericArrayOps<QtDependency> *this,QtDependency *b,QtDependency *e)

{
  QtDependency *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QtDependency>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QtDependency>).size;
    do {
      pDVar2 = (b->relativePath).d.d;
      pQVar1[lVar3].relativePath.d.d = pDVar2;
      pQVar1[lVar3].relativePath.d.ptr = (b->relativePath).d.ptr;
      pQVar1[lVar3].relativePath.d.size = (b->relativePath).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->absolutePath).d.d;
      pQVar1[lVar3].absolutePath.d.d = pDVar2;
      pQVar1[lVar3].absolutePath.d.ptr = (b->absolutePath).d.ptr;
      pQVar1[lVar3].absolutePath.d.size = (b->absolutePath).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<QtDependency>).size + 1;
      (this->super_QArrayDataPointer<QtDependency>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }